

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

void Function_Template::SetupFunction(string *namespaceName)

{
  bool bVar1;
  char *in_RDI;
  size_t in_stack_000000b8;
  ThreadPool *in_stack_000000c0;
  
  bVar1 = std::operator==(namespaceName,in_RDI);
  if (bVar1) {
    simd::EnableSimd(false);
    ThreadPoolMonoid::instance();
    ThreadPool::resize(in_stack_000000c0,in_stack_000000b8);
  }
  else {
    bVar1 = std::operator==(namespaceName,in_RDI);
    if (bVar1) {
      simd::EnableSimd(false);
      simd::EnableAvx(true);
    }
    else {
      bVar1 = std::operator==(namespaceName,in_RDI);
      if (bVar1) {
        simd::EnableSimd(false);
        simd::EnableSse(true);
      }
      else {
        bVar1 = std::operator==(namespaceName,in_RDI);
        if (bVar1) {
          simd::EnableSimd(false);
          simd::EnableNeon(true);
        }
      }
    }
  }
  return;
}

Assistant:

void SetupFunction( const std::string & namespaceName )
    {
        if ( namespaceName == "function_pool" ) {
            simd::EnableSimd( true );
            ThreadPoolMonoid::instance().resize( 4 );
        }
        else if ( namespaceName == "image_function_avx" ) {
            simd::EnableSimd( false );
            simd::EnableAvx( true );
        }
        else if ( namespaceName == "image_function_sse" ) {
            simd::EnableSimd( false );
            simd::EnableSse( true );
        }
        else if ( namespaceName == "image_function_neon" ) {
            simd::EnableSimd( false );
            simd::EnableNeon( true );
        }
    }